

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

bool re2::PCRE::Arg::parse_double(char *str,int n,void *dest)

{
  int *piVar1;
  double dVar2;
  double r;
  char *end;
  char buf [200];
  void *dest_local;
  int n_local;
  char *str_local;
  
  if (n == 0) {
    str_local._7_1_ = false;
  }
  else if (n < 200) {
    memcpy(&end,str,(long)n);
    buf[(long)n + -8] = '\0';
    piVar1 = __errno_location();
    *piVar1 = 0;
    dVar2 = strtod((char *)&end,(char **)&r);
    if ((char *)r == buf + (long)n + -8) {
      piVar1 = __errno_location();
      if (*piVar1 == 0) {
        if (dest == (void *)0x0) {
          str_local._7_1_ = true;
        }
        else {
          *(double *)dest = dVar2;
          str_local._7_1_ = true;
        }
      }
      else {
        str_local._7_1_ = false;
      }
    }
    else {
      str_local._7_1_ = false;
    }
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

bool PCRE::Arg::parse_double(const char* str, int n, void* dest) {
  if (n == 0) return false;
  static const int kMaxLength = 200;
  char buf[kMaxLength];
  if (n >= kMaxLength) return false;
  memcpy(buf, str, n);
  buf[n] = '\0';
  errno = 0;
  char* end;
  double r = strtod(buf, &end);
  if (end != buf + n) {
#ifdef _WIN32
    // Microsoft's strtod() doesn't handle inf and nan, so we have to
    // handle it explicitly.  Speed is not important here because this
    // code is only called in unit tests.
    bool pos = true;
    const char* i = buf;
    if ('-' == *i) {
      pos = false;
      ++i;
    } else if ('+' == *i) {
      ++i;
    }
    if (0 == stricmp(i, "inf") || 0 == stricmp(i, "infinity")) {
      r = std::numeric_limits<double>::infinity();
      if (!pos)
        r = -r;
    } else if (0 == stricmp(i, "nan")) {
      r = std::numeric_limits<double>::quiet_NaN();
    } else {
      return false;
    }
#else
    return false;   // Leftover junk
#endif
  }
  if (errno) return false;
  if (dest == NULL) return true;
  *(reinterpret_cast<double*>(dest)) = r;
  return true;
}